

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# codegen_c.hpp
# Opt level: O3

size_t __thiscall CodegenC::FunctionTable::look_up(FunctionTable *this,Function *function)

{
  _Rb_tree_header *p_Var1;
  mapped_type mVar2;
  _Base_ptr p_Var3;
  mapped_type *pmVar4;
  _Base_ptr p_Var5;
  Function *local_10;
  
  p_Var5 = (this->functions)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
  if (p_Var5 != (_Base_ptr)0x0) {
    p_Var1 = &(this->functions)._M_t._M_impl.super__Rb_tree_header;
    p_Var3 = &p_Var1->_M_header;
    do {
      if (*(Function **)(p_Var5 + 1) >= function) {
        p_Var3 = p_Var5;
      }
      p_Var5 = (&p_Var5->_M_left)[*(Function **)(p_Var5 + 1) < function];
    } while (p_Var5 != (_Base_ptr)0x0);
    if (((_Rb_tree_header *)p_Var3 != p_Var1) && (*(Function **)(p_Var3 + 1) <= function)) {
      return (size_t)p_Var3[1]._M_parent;
    }
  }
  mVar2 = (this->functions)._M_t._M_impl.super__Rb_tree_header._M_node_count;
  local_10 = function;
  pmVar4 = std::
           map<const_Function_*,_unsigned_long,_std::less<const_Function_*>,_std::allocator<std::pair<const_Function_*const,_unsigned_long>_>_>
           ::operator[](&this->functions,&local_10);
  *pmVar4 = mVar2;
  return mVar2;
}

Assistant:

std::size_t look_up(const Function* function) {
			auto iterator = functions.find(function);
			if (iterator != functions.end()) {
				return iterator->second;
			}
			const std::size_t index = functions.size();
			functions[function] = index;
			return index;
		}